

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlloader.c
# Opt level: O0

void * CMdlopen(void *CMTrace_filev,char *in_lib,int mode)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  void *pvVar7;
  char *in_RSI;
  FILE *in_RDI;
  bool bVar8;
  char *cm_lib_prefix;
  char *err_1;
  char *err;
  char *tmp_1;
  char **list;
  FILE *CMTrace_file;
  char *lib;
  char *tmp;
  void *handle;
  dlhandle dlh;
  char **local_50;
  char *local_40;
  char *local_38;
  long local_30;
  long *local_8;
  
  local_30 = 0;
  if (dlopen_verbose == -1) {
    pcVar2 = getenv("CMTransportVerbose");
    dlopen_verbose = (int)(pcVar2 != (char *)0x0);
  }
  pcVar2 = strrchr(in_RSI,0x2e);
  if (dlopen_verbose != 0) {
    fprintf(in_RDI,"Trying to dlopen %s\n",in_RSI);
  }
  if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp(pcVar2,".la"), iVar1 != 0)) {
    local_40 = strdup(in_RSI);
  }
  else {
    sVar3 = strlen(in_RSI);
    local_40 = (char *)malloc(sVar3 + 0xb);
    strcpy(local_40,in_RSI);
    pcVar4 = strrchr(local_40,0x2e);
    strcpy(pcVar4,".so");
    if (dlopen_verbose != 0) {
      fprintf(in_RDI,"Dlopen module name replaced, now %s\n",local_40);
    }
  }
  local_50 = search_list;
  while( true ) {
    bVar8 = false;
    if (local_50 != (char **)0x0) {
      bVar8 = *local_50 != (char *)0x0;
    }
    if (!bVar8) break;
    sVar3 = strlen(*local_50);
    sVar5 = strlen(local_40);
    pcVar4 = (char *)malloc(sVar3 + sVar5 + 2);
    sprintf(pcVar4,"%s/%s",*local_50,local_40);
    local_30 = dlopen(pcVar4,1);
    lVar6 = dlerror();
    if (dlopen_verbose != 0) {
      if (lVar6 == 0) {
        fprintf(in_RDI,"DLopen of %s succeeded\n",pcVar4);
      }
      else {
        fprintf(in_RDI,"Failed to dlopen %s, error is %s\n",pcVar4,lVar6);
      }
    }
    free(pcVar4);
    local_50 = local_50 + 1;
    if (local_30 != 0) {
      local_50 = (char **)0x0;
    }
  }
  if (local_30 == 0) {
    local_30 = dlopen(local_40,1);
    lVar6 = dlerror();
    if (dlopen_verbose != 0) {
      if (lVar6 == 0) {
        fprintf(in_RDI,"DLopen of %s succeeded\n",pcVar2);
      }
      else {
        fprintf(in_RDI,"Failed to dlopen %s, error is %s\n",pcVar2,lVar6);
      }
    }
  }
  if (local_30 == 0) {
    local_8 = (long *)0x0;
  }
  else {
    local_8 = (long *)malloc(0x10);
    local_38 = strrchr(local_40,0x2f);
    if (local_38 == (char *)0x0) {
      local_38 = local_40;
    }
    pcVar2 = strstr(local_38,"adios2_");
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(local_38);
      pvVar7 = malloc(sVar3 + 4);
      local_8[1] = (long)pvVar7;
      strcpy((char *)local_8[1],local_38);
    }
    else {
      sVar3 = strlen(local_38);
      pvVar7 = malloc(sVar3 - 3);
      local_8[1] = (long)pvVar7;
      strncpy((char *)local_8[1],local_38,(long)pcVar2 - (long)local_38);
      strcpy(pcVar2 + (local_8[1] - (long)local_38),pcVar2 + 7);
    }
    pcVar2 = strrchr((char *)local_8[1],0x2e);
    strcpy(pcVar2,"_LTX_");
    *local_8 = local_30;
    free(local_40);
  }
  return local_8;
}

Assistant:

void *
CMdlopen(void *CMTrace_filev, char *in_lib, int mode)
{
#if NO_DYNAMIC_LINKING
    return NULL;
#else
    dlhandle dlh;
    void *handle = NULL;
    char *tmp;
    char *lib;
    FILE *CMTrace_file = (FILE*)CMTrace_filev;
    if (dlopen_verbose == -1) {
	dlopen_verbose = (getenv("CMTransportVerbose") != NULL);
    }
    tmp = strrchr(in_lib, '.');
    if (dlopen_verbose) fprintf(CMTrace_file, "Trying to dlopen %s\n", in_lib);
    if (tmp && (strcmp(tmp, ".la") == 0)) {
	/* can't open .la files */
	lib = malloc(strlen(in_lib) + strlen(MODULE_EXT) + 8);
	strcpy(lib, in_lib);
	strcpy(strrchr(lib, '.'), MODULE_EXT);
	if (dlopen_verbose) fprintf(CMTrace_file, "Dlopen module name replaced, now %s\n", lib);
    } else {
	lib = strdup(in_lib);
    }
    char **list = search_list;
    while(list && (list[0] != NULL)) {
        char *tmp = malloc(strlen(list[0]) + strlen(lib) + 2);
	sprintf(tmp, "%s/%s", list[0], lib);
	handle = dlopen(tmp, RTLD_LAZY);
	const char *err = dlerror();
	if (dlopen_verbose) {
	    if (err) {
		fprintf(CMTrace_file, "Failed to dlopen %s, error is %s\n", tmp, err);
	    } else {
		fprintf(CMTrace_file, "DLopen of %s succeeded\n", tmp);
	    }
	}
	free(tmp);
 	list++;
	if (handle) list = NULL; // fall out
    }
    if (!handle) {
        handle = dlopen(lib, RTLD_LAZY);
	const char *err = dlerror();
	if (dlopen_verbose) {
	    if (err) {
		fprintf(CMTrace_file, "Failed to dlopen %s, error is %s\n", tmp, err);
	    } else {
		fprintf(CMTrace_file, "DLopen of %s succeeded\n", tmp);
	    }
	}
    }
    if (!handle) return NULL;
    dlh = malloc(sizeof(*dlh));
    tmp = strrchr(lib, '/'); /* find name start */
    if (!tmp) tmp = lib;

    char *cm_lib_prefix;
    if(strlen(CM_LIBRARY_PREFIX) > 0 &&
      (cm_lib_prefix = strstr(tmp, CM_LIBRARY_PREFIX))) {
      dlh->lib_prefix = malloc(strlen(tmp) - strlen(CM_LIBRARY_PREFIX) + 4);
      strncpy(dlh->lib_prefix, tmp, cm_lib_prefix-tmp);
      strcpy(dlh->lib_prefix + (cm_lib_prefix - tmp),
          cm_lib_prefix + strlen(CM_LIBRARY_PREFIX));
    }
    else {
      dlh->lib_prefix = malloc(strlen(tmp) + 4);
      strcpy(dlh->lib_prefix, tmp);
    }
    tmp = strrchr(dlh->lib_prefix, '.');
    strcpy(tmp, "_LTX_");  /* kill postfix, add _LTX_ */
    dlh->dlopen_handle = handle;
    free(lib);
    return (void*)dlh;
#endif
}